

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Importer_resolveSineImportsModelFromFile_Test::TestBody
          (Importer_resolveSineImportsModelFromFile_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr p;
  long *local_98;
  AssertHelper local_90 [8];
  long *local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78 [2];
  AssertionResult local_68;
  long local_58 [2];
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"sine_approximations_import.xml","");
  fileContents((string *)&local_68);
  libcellml::Parser::parseModel(local_48);
  if ((long *)CONCAT71(local_68._1_7_,local_68.success_) != local_58) {
    operator_delete((long *)CONCAT71(local_68._1_7_,local_68.success_),local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_38,0));
  local_88 = (long *)0x0;
  local_98 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_68,"size_t(0)","p->issueCount()",(unsigned_long *)&local_88,
             (unsigned_long *)&local_98);
  if (local_68.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (local_68.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/file_parser.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_88 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::Model::hasUnresolvedImports();
  local_88 = (long *)CONCAT71(local_88._1_7_,cVar1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)&local_88,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/file_parser.cpp"
               ,0x2d,(char *)CONCAT71(local_68._1_7_,local_68.success_));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_68._1_7_,local_68.success_) != local_58) {
      operator_delete((long *)CONCAT71(local_68._1_7_,local_68.success_),local_58[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  resourcePath((string *)&local_68);
  libcellml::Importer::resolveImports(local_38,local_48);
  if ((long *)CONCAT71(local_68._1_7_,local_68.success_) != local_58) {
    operator_delete((long *)CONCAT71(local_68._1_7_,local_68.success_),local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  cVar1 = libcellml::Model::hasUnresolvedImports();
  local_88 = (long *)(CONCAT71(local_88._1_7_,cVar1) ^ 1);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)&local_88,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/file_parser.cpp"
               ,0x2f,(char *)CONCAT71(local_68._1_7_,local_68.success_));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_68._1_7_,local_68.success_) != local_58) {
      operator_delete((long *)CONCAT71(local_68._1_7_,local_68.success_),local_58[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, resolveSineImportsModelFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("sine_approximations_import.xml"));
    auto importer = libcellml::Importer::create();
    EXPECT_EQ(size_t(0), p->issueCount());

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());
}